

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_event.c
# Opt level: O3

int luv_fs_event_start(lua_State *L)

{
  uint flags;
  int iVar1;
  int iVar2;
  uint uVar3;
  uv_fs_event_t *handle;
  char *path;
  int iVar4;
  int in_ESI;
  
  handle = luv_check_fs_event(L,in_ESI);
  path = luaL_checklstring(L,2,(size_t *)0x0);
  iVar4 = 3;
  luaL_checktype(L,3,5);
  lua_getfield(L,3,"watch_entry");
  iVar1 = lua_toboolean(L,-1);
  lua_settop(L,-2);
  lua_getfield(L,3,"stat");
  iVar2 = lua_toboolean(L,-1);
  uVar3 = (iVar1 != 0) + 2;
  if (iVar2 == 0) {
    uVar3 = (uint)(iVar1 != 0);
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"recursive");
  iVar1 = lua_toboolean(L,-1);
  flags = uVar3 + 4;
  if (iVar1 == 0) {
    flags = uVar3;
  }
  lua_settop(L,-2);
  luv_check_callback(L,(luv_handle_t *)handle->data,1,4);
  uVar3 = uv_fs_event_start(handle,luv_fs_event_cb,path,flags);
  if ((int)uVar3 < 0) {
    luv_error(L,uVar3);
  }
  else {
    lua_pushinteger(L,(ulong)uVar3);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int luv_fs_event_start(lua_State* L) {
  uv_fs_event_t* handle = luv_check_fs_event(L, 1);
  const char* path = luaL_checkstring(L, 2);
  int flags = 0, ret;
  luaL_checktype(L, 3, LUA_TTABLE);
  lua_getfield(L, 3, "watch_entry");
  if (lua_toboolean(L, -1)) flags |= UV_FS_EVENT_WATCH_ENTRY;
  lua_pop(L, 1);
  lua_getfield(L, 3, "stat");
  if (lua_toboolean(L, -1)) flags |= UV_FS_EVENT_STAT;
  lua_pop(L, 1);
  lua_getfield(L, 3, "recursive");
  if (lua_toboolean(L, -1)) flags |= UV_FS_EVENT_RECURSIVE;
  lua_pop(L, 1);
  luv_check_callback(L, (luv_handle_t*)handle->data, LUV_FS_EVENT, 4);
  ret = uv_fs_event_start(handle, luv_fs_event_cb, path, flags);
  return luv_result(L, ret);
}